

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::ByteSizeLong
          (ExtensionRangeOptions_Declaration *this)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = *(uint *)&this->field_0;
  if ((uVar1 & 0x1f) == 0) {
    sVar3 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      lVar5 = 0;
    }
    else {
      sVar3 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.full_name_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      lVar5 = sVar3 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      lVar5 = lVar5 + sVar3 + 1;
    }
    if ((uVar1 & 4) != 0) {
      uVar4 = (long)(this->field_0)._impl_.number_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar5 = lVar5 + (ulong)((int)lVar2 * 9 + 0x89U >> 6);
    }
    sVar3 = (ulong)((uVar1 >> 3 & 2) + (uVar1 >> 2 & 2)) + lVar5;
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ExtensionRangeOptions_Declaration::ByteSizeLong() const {
          const ExtensionRangeOptions_Declaration& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions.Declaration)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

          ::_pbi::Prefetch5LinesFrom7Lines(&this_);
          cached_has_bits = this_._impl_._has_bits_[0];
          if (cached_has_bits & 0x0000001fu) {
            // optional string full_name = 2;
            if (cached_has_bits & 0x00000001u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_full_name());
            }
            // optional string type = 3;
            if (cached_has_bits & 0x00000002u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_type());
            }
            // optional int32 number = 1;
            if (cached_has_bits & 0x00000004u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_number());
            }
            // optional bool reserved = 5;
            if (cached_has_bits & 0x00000008u) {
              total_size += 2;
            }
            // optional bool repeated = 6;
            if (cached_has_bits & 0x00000010u) {
              total_size += 2;
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }